

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_widget_has_mouse_click_down(nk_context *ctx,nk_buttons btn,int down)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_rect b;
  int iVar7;
  int iVar8;
  nk_rect bounds;
  nk_rect v;
  nk_rect local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  nk_rect local_58;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x49cb,
                  "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    iVar8 = 0;
    iVar7 = 0;
    if (ctx->active == pnVar1) {
      pnVar2 = pnVar1->layout;
      uVar3 = (pnVar2->clip).x;
      uVar4 = (pnVar2->clip).y;
      uVar5 = (pnVar2->clip).w;
      uVar6 = (pnVar2->clip).h;
      local_68 = (float)(int)(float)uVar3;
      fStack_64 = (float)(int)(float)uVar4;
      fStack_60 = (float)(int)(float)uVar5;
      fStack_5c = (float)(int)(float)uVar6;
      local_58.y = fStack_64;
      local_58.x = local_68;
      local_58.h = fStack_5c;
      local_58.w = fStack_60;
      nk_layout_peek(&local_78,ctx);
      nk_unify(&local_40,&local_58,local_78.x,local_78.y,local_78.w + local_78.x,
               local_78.h + local_78.y);
      iVar7 = iVar8;
      if ((((local_78.x <= fStack_60 + local_68) && (local_68 <= local_78.x + local_78.w)) &&
          (local_78.y <= fStack_5c + fStack_64)) && (fStack_64 <= local_78.y + local_78.h)) {
        b.y = local_78.y;
        b.x = local_78.x;
        b.w = local_78.w;
        b.h = local_78.h;
        iVar7 = nk_input_has_mouse_click_down_in_rect(&ctx->input,btn,b,down);
      }
    }
    return iVar7;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x49cc,
                "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
}

Assistant:

NK_API int
nk_widget_has_mouse_click_down(struct nk_context *ctx, enum nk_buttons btn, int down)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_has_mouse_click_down_in_rect(&ctx->input, btn, bounds, down);
}